

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_14UL> *params,
          ArrayPtr<const_char> *params_1)

{
  size_t __n;
  long lVar1;
  size_t size;
  char *__dest;
  long local_38 [2];
  
  local_38[0] = *(long *)this;
  local_38[1] = *(undefined8 *)params->content;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_38 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  heapString(__return_storage_ptr__,size);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __n = *(size_t *)this;
  if (__n != 0) {
    memcpy(__dest,this + 8,__n);
    __dest = __dest + __n;
  }
  if (*(size_t *)params->content != 0) {
    memcpy(__dest,(void *)params->currentSize,*(size_t *)params->content);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}